

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

Image * rw::ps2::rasterToImage(Raster *raster)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  Image *this;
  uint8 *puVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint8 *out;
  uint8 *puVar11;
  
  uVar8 = raster->format;
  uVar10 = uVar8 & 0xf00;
  iVar4 = 0;
  if ((uVar8 >> 0xe & 1) == 0) {
    iVar9 = 0x18;
    if (uVar10 != 0x600) {
      iVar9 = (uint)(uVar10 == 0x500) * 0x10 + 0x10;
    }
    if ((uVar8 >> 0xd & 1) == 0) {
      bVar2 = true;
      bVar3 = false;
      goto LAB_0012b54b;
    }
    iVar9 = 8;
    iVar4 = 0x100;
  }
  else {
    iVar9 = 4;
    iVar4 = 0x10;
  }
  bVar3 = true;
  bVar2 = false;
LAB_0012b54b:
  lVar5 = (long)nativeRasterOffset;
  this = Image::create(raster->width,raster->height,iVar9);
  Image::allocate(this);
  if (!bVar2) {
    puVar11 = this->palette;
    puVar6 = Raster::lockPalette(raster,2);
    if (uVar10 == 0x500) {
      memcpy(puVar11,puVar6,(ulong)(uint)(iVar4 * 4));
      if (bVar3) {
        lVar7 = 0;
        do {
          puVar11[lVar7 * 4 + 3] = (uint8)((uint)puVar11[lVar7 * 4 + 3] * 0xff >> 7);
          lVar7 = lVar7 + 1;
        } while (iVar4 + (uint)(iVar4 == 0) != (int)lVar7);
      }
    }
    else {
      memcpy(puVar11,puVar6,(ulong)(uint)(iVar4 * 2));
    }
    Raster::unlockPalette(raster);
  }
  bVar1 = *(byte *)((long)&raster->pixels + lVar5 + 4);
  uVar8 = 8;
  if (iVar9 != 4) {
    uVar8 = (bVar1 & 2) * 4 + 8;
  }
  uVar10 = 0x20;
  if ((bVar1 & 4) == 0) {
    uVar10 = uVar8;
  }
  if (iVar9 != 4) {
    uVar10 = uVar8;
  }
  if ((int)uVar10 < raster->width) {
    uVar10 = raster->width;
  }
  puVar11 = this->pixels;
  puVar6 = Raster::lock(raster,0,2);
  if (iVar9 == 4) {
    expandPal4(puVar11,this->stride,puVar6,uVar10 >> 1,raster->width,raster->height);
  }
  else if (iVar9 == 8) {
    copyPal8(puVar11,this->stride,puVar6,uVar10,raster->width,raster->height);
  }
  else if (0 < this->height) {
    iVar4 = 0;
    do {
      if (0 < this->width) {
        iVar9 = 0;
        out = puVar11;
        do {
          switch((raster->format & 0xf00U) - 0x100 >> 8) {
          case 0:
            conv_ABGR1555_from_ARGB1555(out,puVar6);
            break;
          default:
            goto switchD_0012b6ff_caseD_1;
          case 4:
            *out = *puVar6;
            out[1] = puVar6[1];
            out[2] = puVar6[2];
            out[3] = (uint8)((uint)puVar6[3] * 0xff >> 7);
            goto LAB_0012b75d;
          case 5:
            *out = *puVar6;
            out[1] = puVar6[1];
            out[2] = puVar6[2];
LAB_0012b75d:
            puVar6 = puVar6 + 4;
            goto switchD_0012b6ff_caseD_1;
          case 9:
            conv_ABGR1555_from_ARGB1555(out,puVar6);
            out[1] = out[1] | 0x80;
          }
          puVar6 = puVar6 + 2;
switchD_0012b6ff_caseD_1:
          out = out + this->bpp;
          iVar9 = iVar9 + 1;
        } while (iVar9 < this->width);
      }
      puVar11 = puVar11 + this->stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->height);
  }
  Raster::unlock(raster,0);
  return this;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	Image *image;
	int depth;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);

	int32 rasterFormat = raster->format & 0xF00;
	switch(rasterFormat){
	case Raster::C1555:
		depth = 16;
		break;
	case Raster::C8888:
		depth = 32;
		break;
	case Raster::C888:
		depth = 24;
		break;
	case Raster::C555:
		depth = 16;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		assert(0 && "unsupported ps2 raster format");
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		out = image->palette;
		in = raster->lockPalette(Raster::LOCKREAD);
		if(rasterFormat == Raster::C8888){
			memcpy(out, in, pallength*4);
			for(int32 i = 0; i < pallength; i++){
				out[3] = out[3]*255/128;
				out += 4;
			}
		}else
			memcpy(out, in, pallength*2);
		raster->unlockPalette();
	}

	int minw, minh;
	int tw;
	transferMinSize(depth == 4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	tw = max(raster->width, minw);
	uint8 *dst = image->pixels;
	in = raster->lock(0, Raster::LOCKREAD);
	if(depth == 4){
		expandPal4(dst, image->stride, in, tw/2, raster->width, raster->height);
	}else if(depth == 8){
		copyPal8(dst, image->stride, in, tw, raster->width, raster->height);
	}else{
		for(int32 y = 0; y < image->height; y++){
			out = dst;
			for(int32 x = 0; x < image->width; x++){
				switch(raster->format & 0xF00){
				case Raster::C8888:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = in[3]*255/128;
					in += 4;
					break;
				case Raster::C888:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					in += 4;
					break;
				case Raster::C1555:
					conv_ARGB1555_from_ABGR1555(out, in);
					in += 2;
					break;
				case Raster::C555:
					conv_ARGB1555_from_ABGR1555(out, in);
					out[1] |= 0x80;
					in += 2;
					break;
				default:
					assert(0 && "unknown ps2 raster format");
					break;
				}
				out += image->bpp;
			}
			dst += image->stride;
		}
	}
	raster->unlock(0);

	return image;
}